

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderLogCase::iterate(ShaderLogCase *this)

{
  undefined4 shader_00;
  bool bVar1;
  int iVar2;
  deUint32 type;
  deBool dVar3;
  TestLog *pTVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  int *params;
  uint *puVar6;
  ContextType *contextType;
  Enum<int,_2UL> EVar7;
  GetNameFunc local_4e8;
  int local_4e0;
  string local_4d8;
  allocator<char> local_4b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  GLenum local_42c;
  code *pcStack_428;
  deUint32 err_2;
  undefined8 local_420;
  GetNameFunc local_418;
  int local_410;
  GetNameFunc local_408;
  int local_400;
  string local_3f8;
  allocator<char> local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  GLenum local_34c;
  GetNameFunc p_Stack_348;
  deUint32 err_1;
  int local_340;
  GetNameFunc local_338;
  int local_330;
  string local_328;
  allocator<char> local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  GLenum local_27c;
  undefined1 local_278 [4];
  deUint32 err;
  undefined1 local_f4 [8];
  StateQueryMemoryWriteGuard<int> logLen;
  char *brokenSource;
  undefined1 local_d8 [8];
  string source;
  undefined1 local_b0 [4];
  deUint32 shader;
  CallLogWrapper gl;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  ResultCollector result;
  ShaderLogCase *this_local;
  
  result.m_message.field_2._8_8_ = this;
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_60,pTVar4,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_b0,(Functions *)CONCAT44(extraout_var,iVar2),pTVar4);
  source.field_2._12_4_ = 0;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  brokenSource._4_4_ = (*pRVar5->_vptr_RenderContext[2])();
  (anonymous_namespace)::brokenShaderSource_abi_cxx11_
            ((string *)local_d8,(_anonymous_namespace_ *)((long)&brokenSource + 4),contextType);
  logLen._4_8_ = std::__cxx11::string::c_str();
  gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_f4);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_b0,true);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_278,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_278,
                       (char (*) [40])"Trying to compile broken shader source.");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_278);
  type = glu::getGLShaderType(this->m_shaderType);
  source.field_2._12_4_ = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)local_b0,type);
  do {
    local_27c = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_b0);
    if (local_27c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"Got Error ",&local_301);
      EVar7 = glu::getErrorStr(local_27c);
      p_Stack_348 = EVar7.m_getName;
      local_340 = EVar7.m_value;
      local_338 = p_Stack_348;
      local_330 = local_340;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_328,&local_338);
      std::operator+(&local_2e0,&local_300,&local_328);
      std::operator+(&local_2c0,&local_2e0,": ");
      std::operator+(&local_2a0,&local_2c0,"create shader");
      tcu::ResultCollector::fail((ResultCollector *)local_60,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  glu::CallLogWrapper::glShaderSource
            ((CallLogWrapper *)local_b0,source.field_2._12_4_,1,(GLchar **)&logLen.m_value,
             (GLint *)0x0);
  glu::CallLogWrapper::glCompileShader((CallLogWrapper *)local_b0,source.field_2._12_4_);
  do {
    local_34c = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_b0);
    if (local_34c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"Got Error ",&local_3d1);
      EVar7 = glu::getErrorStr(local_34c);
      local_418 = EVar7.m_getName;
      local_410 = EVar7.m_value;
      local_408 = local_418;
      local_400 = local_410;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_3f8,&local_408);
      std::operator+(&local_3b0,&local_3d0,&local_3f8);
      std::operator+(&local_390,&local_3b0,": ");
      std::operator+(&local_370,&local_390,"compile");
      tcu::ResultCollector::fail((ResultCollector *)local_60,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
    }
    dVar3 = ::deGetFalse();
    shader_00 = source.field_2._12_4_;
  } while (dVar3 != 0);
  params = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_f4);
  glu::CallLogWrapper::glGetShaderiv((CallLogWrapper *)local_b0,shader_00,0x8b84,params);
  gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)local_f4,(ResultCollector *)local_60);
  bVar1 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::isUndefined
                    ((StateQueryMemoryWriteGuard<int> *)local_f4);
  if (!bVar1) {
    puVar6 = (uint *)gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                               ((StateQueryMemoryWriteGuard *)local_f4);
    pcStack_428 = glu::CallLogWrapper::glGetShaderInfoLog;
    local_420 = 0;
    verifyInfoLogQuery((Functional *)local_60,(ResultCollector *)local_b0,
                       (CallLogWrapper *)(ulong)*puVar6,source.field_2._12_4_,0xd95a30,0,
                       "glGetShaderInfoLog");
  }
  glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)local_b0,source.field_2._12_4_);
  do {
    local_42c = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_b0);
    if (local_42c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"Got Error ",&local_4b1);
      EVar7 = glu::getErrorStr(local_42c);
      local_4e8 = EVar7.m_getName;
      local_4e0 = EVar7.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_4d8,&local_4e8);
      std::operator+(&local_490,&local_4b0,&local_4d8);
      std::operator+(&local_470,&local_490,": ");
      std::operator+(&local_450,&local_470,"delete");
      tcu::ResultCollector::fail((ResultCollector *)local_60,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_60,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::__cxx11::string::~string((string *)local_d8);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_b0);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_60);
  return STOP;
}

Assistant:

ShaderLogCase::IterateResult ShaderLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	tcu::ResultCollector					result			(m_testCtx.getLog());
	glu::CallLogWrapper						gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	deUint32								shader			= 0;
	const std::string						source			= brokenShaderSource(m_context.getRenderContext().getType());
	const char* const						brokenSource	= source.c_str();
	StateQueryMemoryWriteGuard<glw::GLint>	logLen;

	gl.enableLogging(true);

	m_testCtx.getLog() << tcu::TestLog::Message << "Trying to compile broken shader source." << tcu::TestLog::EndMessage;

	shader = gl.glCreateShader(glu::getGLShaderType(m_shaderType));
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "create shader");

	gl.glShaderSource(shader, 1, &brokenSource, DE_NULL);
	gl.glCompileShader(shader);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "compile");

	gl.glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logLen);
	logLen.verifyValidity(result);

	if (!logLen.isUndefined())
		verifyInfoLogQuery(result, gl, logLen, shader, &glu::CallLogWrapper::glGetShaderInfoLog, "glGetShaderInfoLog");

	gl.glDeleteShader(shader);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "delete");

	result.setTestContextResult(m_testCtx);
	return STOP;
}